

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O1

void Centaurus::DryParserEM64T<char>::emit_machine
               (X86Assembler *as,ATNMachine<char> *machine,
               unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
               *machine_map,CompositeATN<char> *catn,Identifier *id,Label *rejectlabel,
               MyConstPool *pool)

{
  pointer pAVar1;
  anon_union_8_2_78723da6_for_MemData_2 aVar2;
  CompositeATN<char> *catn_00;
  int iVar3;
  Operand_ *o0;
  Label *__args;
  int iVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> statelabels;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> exitlabels;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> local_e8;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> local_c8;
  UInt64 local_a8;
  UInt64 aUStack_a0 [3];
  _Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_88;
  CompositeATN<char> *local_80;
  Identifier *local_78;
  ATNPath local_70;
  ATNPath local_50;
  
  local_e8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_finish = (Label *)0x0;
  local_e8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Label *)0x0;
  local_88 = (_Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)machine_map;
  local_80 = catn;
  local_78 = id;
  if (0 < (int)((ulong)((long)(machine->m_nodes).
                              super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(machine->m_nodes).
                             super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x286bca1b) {
    iVar4 = 0;
    do {
      (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])(&local_a8);
      if (local_e8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_e8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::_M_realloc_insert<asmjit::Label>
                  (&local_e8,
                   (iterator)
                   local_e8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(Label *)&local_a8.field_10);
      }
      else {
        ((local_e8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
          super__Vector_impl_data._M_finish)->super_Operand).super_Operand_.field_0._packed[0] =
             local_a8;
        ((local_e8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
          super__Vector_impl_data._M_finish)->super_Operand).super_Operand_.field_0._mem.field_2 =
             (anon_union_8_2_78723da6_for_MemData_2)aUStack_a0[0];
        local_e8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_e8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      iVar4 = iVar4 + 1;
      iVar3 = (int)((ulong)((long)(machine->m_nodes).
                                  super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(machine->m_nodes).
                                 super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
    } while (SBORROW4(iVar4,iVar3 * 0x286bca1b) != iVar4 + iVar3 * -0x286bca1b < 0);
  }
  if (0 < (int)((ulong)((long)(machine->m_nodes).
                              super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(machine->m_nodes).
                             super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x286bca1b) {
    lVar5 = 0;
    do {
      (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])
                (as,local_e8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                    _M_impl.super__Vector_impl_data._M_start + lVar5);
      pAVar1 = (machine->m_nodes).
               super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      switch(pAVar1[lVar5].m_type) {
      case Nonterminal:
        o0 = (Operand_ *)
             std::__detail::
             _Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[](local_88,&pAVar1[lVar5].m_invoke);
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x3b,o0);
        break;
      case LiteralTerminal:
        MatchRoutineEM64T<char>::emit(as,pool,rejectlabel,&pAVar1[lVar5].m_literal);
        break;
      case RegularTerminal:
        DFA<char>::DFA((DFA<char> *)&local_a8.field_10,&pAVar1[lVar5].m_nfa,true);
        DFARoutineEM64T<char>::emit(as,rejectlabel,(DFA<char> *)&local_a8.field_10,pool);
        local_a8.f64 = (double)&PTR__NFABase_001a0ed8;
        std::vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_>::~vector
                  ((vector<Centaurus::DFAState<char>,_std::allocator<Centaurus::DFAState<char>_>_> *
                   )&aUStack_a0[0].field_10);
        break;
      case WhiteSpace:
        SkipRoutineEM64T<char>::emit(as);
      }
      lVar6 = *(long *)&pAVar1[lVar5].m_transitions.
                        super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
                        ._M_impl.super__Vector_impl_data;
      uVar7 = (int)((long)pAVar1[lVar5].m_transitions.
                          super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - lVar6 >> 3) * -0x55555555;
      if (uVar7 == 1) {
        asmjit::CodeEmitter::emit
                  ((CodeEmitter *)as,0x11e,
                   (Operand_ *)
                   (local_e8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                    _M_impl.super__Vector_impl_data._M_start + *(int *)(lVar6 + 0xc)));
      }
      else if (uVar7 == 0) {
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x276);
      }
      else {
        local_c8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_c8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
        super__Vector_impl_data._M_finish = (Label *)0x0;
        local_c8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (Label *)0x0;
        if (0 < (int)uVar7) {
          uVar8 = (ulong)(uVar7 & 0x7fffffff);
          lVar6 = 0xc;
          do {
            __args = local_e8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                     _M_impl.super__Vector_impl_data._M_start +
                     *(int *)(*(long *)&pAVar1[lVar5].m_transitions.
                                        super__Vector_base<Centaurus::ATNTransition<char>,_std::allocator<Centaurus::ATNTransition<char>_>_>
                                        ._M_impl.super__Vector_impl_data + lVar6);
            if (local_c8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_c8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<asmjit::Label,std::allocator<asmjit::Label>>::
              _M_realloc_insert<asmjit::Label_const&>
                        ((vector<asmjit::Label,std::allocator<asmjit::Label>> *)&local_c8,
                         (iterator)
                         local_c8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                         _M_impl.super__Vector_impl_data._M_finish,__args);
            }
            else {
              aVar2 = (__args->super_Operand).super_Operand_.field_0._mem.field_2;
              ((local_c8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
                super__Vector_impl_data._M_finish)->super_Operand).super_Operand_.field_0._packed[0]
                   = (__args->super_Operand).super_Operand_.field_0._packed[0];
              ((local_c8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
                super__Vector_impl_data._M_finish)->super_Operand).super_Operand_.field_0._mem.
              field_2 = aVar2;
              local_c8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_c8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            lVar6 = lVar6 + 0x18;
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
        ATNPath::ATNPath(&local_70,local_78,(int)lVar5);
        catn_00 = local_80;
        CompositeATN<char>::convert_atn_path(&local_50,local_80,&local_70);
        LookaheadDFA<char>::LookaheadDFA
                  ((LookaheadDFA<char> *)&local_a8.field_10,catn_00,&local_50,true);
        LDFARoutineEM64T<char>::emit
                  (as,rejectlabel,(LookaheadDFA<char> *)&local_a8.field_10,&local_c8);
        local_a8.f64 = (double)&PTR__NFABase_001a1b10;
        std::vector<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>::
        ~vector((vector<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_> *)
                &aUStack_a0[0].field_10);
        std::
        vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
        ::~vector(&local_50.
                   super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                 );
        std::
        vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
        ::~vector(&local_70.
                   super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                 );
        if (local_c8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (int)((ulong)((long)(machine->m_nodes).
                                         super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(machine->m_nodes).
                                        super__Vector_base<Centaurus::ATNNode<char>,_std::allocator<Centaurus::ATNNode<char>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                     0x286bca1b);
  }
  if (local_e8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void DryParserEM64T<TCHAR>::emit_machine(asmjit::X86Assembler& as, const ATNMachine<TCHAR>& machine, std::unordered_map<Identifier, asmjit::Label>& machine_map, const CompositeATN<TCHAR>& catn, const Identifier& id, asmjit::Label& rejectlabel, MyConstPool& pool)
{
    std::vector<asmjit::Label> statelabels;

    for (int i = 0; i < machine.get_node_num(); i++)
    {
        statelabels.push_back(as.newLabel());
    }

    for (int i = 0; i < machine.get_node_num(); i++)
    {
        as.bind(statelabels[i]);

        const ATNNode<TCHAR>& node = machine.get_node(i);

        switch (node.type())
        {
        case ATNNodeType::Blank:
            break;
        case ATNNodeType::LiteralTerminal:
            MatchRoutineEM64T<TCHAR>::emit(as, pool, rejectlabel, node.get_literal());
            break;
        case ATNNodeType::Nonterminal:
            as.call(machine_map[node.get_invoke()]);
            break;
        case ATNNodeType::RegularTerminal:
            DFARoutineEM64T<TCHAR>::emit(as, rejectlabel, DFA<TCHAR>(node.get_nfa()), pool);
            break;
        case ATNNodeType::WhiteSpace:
            SkipRoutineEM64T<TCHAR>::emit(as);
            break;
        }

        int outbound_num = node.get_transitions().size();
        if (outbound_num == 0)
        {
            as.ret();
        }
        else if (outbound_num == 1)
        {
            as.jmp(statelabels[node.get_transition(0).dest()]);
        }
        else
        {
            std::vector<asmjit::Label> exitlabels;

            for (int j = 0; j < outbound_num; j++)
            {
                exitlabels.push_back(statelabels[node.get_transition(j).dest()]);
            }

            LDFARoutineEM64T<TCHAR>::emit(as, rejectlabel, LookaheadDFA<TCHAR>(catn, catn.convert_atn_path(ATNPath(id, i))), exitlabels);
        }
    }
}